

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offline-ekf-flexibility-estimation.hxx
# Opt level: O3

IndexedMatrixArray *
stateObservation::examples::offlineEKFFlexibilityEstimation
          (IndexedMatrixArray *y,Matrix *xh0,uint numberOfContacts,
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *contactsPositions,double dt)

{
  IndexedMatrixArray *pIVar1;
  uint uVar2;
  ulong uVar3;
  undefined4 in_register_00000014;
  long lVar4;
  long lVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  IndexedMatrixArray *in_R8;
  double *pdVar11;
  uint uVar12;
  IndexedMatrixArray u;
  assign_op<double,_double> local_d5;
  uint local_d4;
  undefined8 local_d0;
  IndexedMatrixArray *local_c8;
  IndexedMatrixArray *local_c0;
  undefined1 local_b8 [24];
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_68;
  undefined8 local_60 [2];
  undefined8 local_50;
  void *local_48 [3];
  
  local_d0 = CONCAT44(in_register_00000014,numberOfContacts);
  local_d4 = (uint)contactsPositions;
  local_c8 = in_R8;
  local_c0 = y;
  stateObservation::IndexedMatrixArray::IndexedMatrixArray((IndexedMatrixArray *)local_b8);
  lVar5 = xh0[3].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  pdVar7 = xh0[2].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
  lVar6 = xh0[2].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  lVar8 = xh0[2].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
  lVar4 = xh0[1].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
  pdVar11 = xh0[1].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
  ;
  iVar10 = *(int *)&(xh0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                    m_storage.m_data;
  uVar12 = 0xffffffff;
  if ((lVar6 - lVar8 >> 3) * -0x5555555555555555 +
      ((lVar5 - (long)pdVar7 >> 3) + -1 + (ulong)(lVar5 == 0)) * 0x15 !=
      (lVar4 - (long)pdVar11 >> 3) * 0x5555555555555555) {
    uVar12 = iVar10 - 1;
  }
  do {
    pIVar1 = local_c0;
    lVar5 = (lVar4 - (long)pdVar11 >> 3) * -0x5555555555555555 +
            (lVar6 - lVar8 >> 3) * -0x5555555555555555 +
            ((lVar5 - (long)pdVar7 >> 3) + -1 + (ulong)(lVar5 == 0)) * 0x15;
    uVar2 = iVar10 + -1 + (int)lVar5;
    if (lVar5 == 0) {
      uVar2 = 0;
    }
    if (uVar2 < uVar12) {
      offlineEKFFlexibilityEstimation
                (local_c0,(IndexedMatrixArray *)xh0,(Matrix *)local_b8,(uint)local_d0,
                 (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)(ulong)local_d4,0.0,local_c8,(IndexedMatrixArray *)0x0);
      std::
      deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::~deque((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)(local_b8 + 8));
      return pIVar1;
    }
    local_60[0] = 0xf;
    local_50 = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_48,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_60);
    lVar5 = (local_80 - local_78 >> 3) * -0x5555555555555555 +
            ((local_68 - local_88 >> 3) + -1 + (ulong)(local_68 == 0)) * 0x15;
    lVar6 = local_90 - local_a0 >> 3;
    lVar8 = lVar6 * -0x5555555555555555 + lVar5;
    if (lVar8 == 0) {
LAB_00106374:
      if (lVar5 == lVar6 * 0x5555555555555555) {
        local_b8._0_4_ = uVar12;
      }
      std::
      deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::push_back((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   *)(local_b8 + 8),(value_type *)local_48);
    }
    else {
      uVar9 = lVar8 + (ulong)(uint)local_b8._0_4_;
      if ((uVar12 < (uint)local_b8._0_4_) || (uVar9 <= uVar12)) {
        if (uVar9 != uVar12) {
          __assert_fail("(v_.size()==0 || k_+v_.size() == time )&& \"Error: New time instants must be consecutive to existing ones\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/tools/definitions.hxx"
                        ,0xaa,
                        "void stateObservation::IndexedMatrixArray::checkNext_(unsigned int) const")
          ;
        }
        goto LAB_00106374;
      }
      uVar9 = (ulong)(uVar12 - local_b8._0_4_);
      uVar3 = (local_a0 - local_98 >> 3) * -0x5555555555555555 + uVar9;
      if ((long)uVar3 < 0) {
        uVar9 = ~(~uVar3 / 0x15);
LAB_001063e3:
        lVar5 = uVar9 * -0x1f8 + *(long *)(local_88 + uVar9 * 8);
        uVar9 = uVar3;
      }
      else {
        lVar5 = local_a0;
        if (0x14 < uVar3) {
          uVar9 = uVar3 / 0x15;
          goto LAB_001063e3;
        }
      }
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)(lVar5 + uVar9 * 0x18),
                 (Matrix<double,__1,__1,_0,__1,__1> *)local_48,&local_d5);
    }
    free(local_48[0]);
    uVar12 = uVar12 + 1;
    lVar5 = xh0[3].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
    ;
    pdVar7 = xh0[2].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data;
    lVar6 = xh0[2].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
    ;
    lVar8 = xh0[2].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
    ;
    lVar4 = xh0[1].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
    ;
    pdVar11 = xh0[1].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data;
    iVar10 = *(int *)&(xh0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_data;
  } while( true );
}

Assistant:

stateObservation::IndexedMatrixArray offlineEKFFlexibilityEstimation(
            const stateObservation::IndexedMatrixArray & y,
            const Matrix & xh0,
            unsigned numberOfContacts,
            const std::vector<Vector3, Eigen::aligned_allocator<Vector3> > & contactsPositions,
            double dt)
{
    const unsigned inputSize=15;

    ///initialization of a zero input
    stateObservation::IndexedMatrixArray u;
    for (unsigned k=y.getFirstIndex()-1; k<=y.getLastIndex(); ++k)
    {
        u.setValue(Vector::Zero(inputSize,1),k);
    }

    return offlineEKFFlexibilityEstimation
                        (y, u, xh0, numberOfContacts, contactsPositions, dt);
}